

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O2

void __thiscall Js::JavascriptArray::SetLength(JavascriptArray *this,uint32 newLength)

{
  uint uVar1;
  SparseArraySegmentBase *pSVar2;
  Type *pTVar3;
  
  uVar1 = (this->super_ArrayObject).length;
  if (uVar1 == newLength) {
    return;
  }
  pSVar2 = (this->head).ptr;
  if (pSVar2 != EmptySegment) {
    if (newLength == 0) {
      (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject
        .super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])(this,pSVar2,0);
      pSVar2 = (this->head).ptr;
      pSVar2->length = 0;
      (pSVar2->next).ptr = (SparseArraySegmentBase *)0x0;
      SetHasNoMissingValues(this,true);
      ClearSegmentMap(this);
    }
    else {
      if (uVar1 <= newLength) goto LAB_00a41824;
      pTVar3 = &this->head;
      for (pSVar2 = GetBeginLookupSegment(this,newLength - 1,true);
          pSVar2 != (SparseArraySegmentBase *)0x0; pSVar2 = (pSVar2->next).ptr) {
        uVar1 = pSVar2->left;
        if (newLength <= uVar1) {
          ClearSegmentMap(this);
          pTVar3->ptr = (SparseArraySegmentBase *)0x0;
          break;
        }
        if (newLength <= pSVar2->length + uVar1) {
          if ((pSVar2->next).ptr != (SparseArraySegmentBase *)0x0) {
            ClearSegmentMap(this);
            uVar1 = pSVar2->left;
          }
          (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x73])
                    (this,pSVar2,(ulong)(newLength - uVar1));
          (pSVar2->next).ptr = (SparseArraySegmentBase *)0x0;
          pSVar2->length = newLength - uVar1;
          SparseArraySegmentBase::CheckLengthvsSize(pSVar2);
          break;
        }
        pTVar3 = &pSVar2->next;
      }
    }
    InvalidateLastUsedSegment(this);
  }
LAB_00a41824:
  (this->super_ArrayObject).length = newLength;
  (*(this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])(this);
  return;
}

Assistant:

void JavascriptArray::SetLength(uint32 newLength)
    {
        if (newLength == length)
            return;

        if (head == EmptySegment)
        {
            // Do nothing to the segment.
        }
        else if (newLength == 0)
        {
            this->ClearElements(head, 0);
            head->length = 0;
            head->next = nullptr;
            SetHasNoMissingValues();

            ClearSegmentMap();
            this->InvalidateLastUsedSegment();
        }
        else if (newLength < length)
        {
            // _ _ 2 3 _ _ 6 7 _ _

            // SetLength(0)
            // 0 <= left -> set *prev = null
            // SetLength(2)
            // 2 <= left -> set *prev = null
            // SetLength(3)
            // 3 !<= left; 3 <= right -> truncate to length - 1
            // SetLength(5)
            // 5 <=

            SparseArraySegmentBase* next = GetBeginLookupSegment(newLength - 1); // head, or next.left < newLength
            Field(SparseArraySegmentBase*)* prev = &head;

            while(next != nullptr)
            {
                if (newLength <= next->left)
                {
                    ClearSegmentMap(); // truncate segments, null out segmentMap
                    *prev = nullptr;
                    break;
                }
                else if (newLength <= (next->left + next->length))
                {
                    if (next->next)
                    {
                        ClearSegmentMap(); // Will truncate segments, null out segmentMap
                    }

                    uint32 newSegmentLength = newLength - next->left;
                    this->ClearElements(next, newSegmentLength);
                    next->next = nullptr;
                    next->length = newSegmentLength;
                    next->CheckLengthvsSize();
                    break;
                }
                else
                {
                    prev = &next->next;
                    next = next->next;
                }
            }
            this->InvalidateLastUsedSegment();
        }
        this->length = newLength;

#ifdef VALIDATE_ARRAY
        ValidateArray();
#endif
    }